

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O3

alignment_end *
sw_sse2_word(int8_t *ref,int8_t ref_dir,int32_t refLen,int32_t readLen,uint8_t weight_gapO,
            uint8_t weight_gapE,__m128i *vProfile,uint16_t terminate,int32_t maskLen)

{
  short *psVar1;
  ulong *puVar2;
  ushort *puVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  ulong uVar10;
  undefined8 uVar11;
  void *pvVar12;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  alignment_end *paVar13;
  int iVar14;
  ulong uVar15;
  size_t __nmemb;
  int iVar16;
  int iVar17;
  long lVar18;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  long lVar19;
  long lVar20;
  __m128i *pv;
  ushort uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  short sVar49;
  short sVar52;
  undefined1 auVar50 [16];
  short sVar53;
  undefined1 auVar51 [16];
  undefined1 auVar54 [16];
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  undefined1 auVar55 [16];
  short sVar63;
  undefined1 auVar56 [16];
  ushort uVar64;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  undefined1 auVar65 [16];
  int local_60;
  short sVar73;
  
  uVar15 = (long)(readLen + 7) / 8;
  __ptr = calloc((long)refLen,2);
  iVar22 = (int)uVar15;
  __nmemb = (size_t)iVar22;
  __ptr_00 = calloc(__nmemb,0x10);
  __ptr_01 = calloc(__nmemb,0x10);
  __ptr_02 = calloc(__nmemb,0x10);
  __ptr_03 = calloc(__nmemb,0x10);
  iVar16 = refLen + -1;
  if (ref_dir != '\x01') {
    iVar16 = 0;
  }
  iVar14 = -1;
  if (ref_dir != '\x01') {
    iVar14 = refLen;
  }
  if (iVar16 == iVar14) {
    local_60 = 0;
    uVar21 = 0;
  }
  else {
    auVar23 = ZEXT416((uint)CONCAT71(in_register_00000081,weight_gapO));
    auVar23 = pshuflw(auVar23,auVar23,0);
    auVar23._4_4_ = auVar23._0_4_;
    auVar23._8_4_ = auVar23._0_4_;
    auVar23._12_4_ = auVar23._0_4_;
    auVar24 = ZEXT416((uint)CONCAT71(in_register_00000089,weight_gapE));
    auVar24 = pshuflw(auVar24,auVar24,0);
    auVar24._4_4_ = auVar24._0_4_;
    auVar24._8_4_ = auVar24._0_4_;
    auVar24._12_4_ = auVar24._0_4_;
    uVar10 = 1;
    if (1 < iVar22) {
      uVar10 = uVar15;
    }
    lVar20 = (long)iVar16;
    lVar19 = (uVar10 & 0xffffffff) * 0x10;
    uVar25 = 0;
    uVar26 = 0;
    uVar27 = 0;
    uVar28 = 0;
    uVar29 = 0;
    uVar30 = 0;
    uVar31 = 0;
    uVar32 = 0;
    uVar21 = 0;
    local_60 = 0;
    uVar33 = 0;
    uVar34 = 0;
    uVar35 = 0;
    uVar36 = 0;
    uVar37 = 0;
    uVar38 = 0;
    uVar39 = 0;
    uVar40 = 0;
    pvVar12 = __ptr_00;
    do {
      __ptr_00 = __ptr_01;
      __ptr_01 = pvVar12;
      auVar50 = (undefined1  [16])0x0;
      uVar41 = 0;
      uVar42 = 0;
      uVar43 = 0;
      uVar44 = 0;
      uVar45 = 0;
      uVar46 = 0;
      uVar47 = 0;
      uVar48 = 0;
      if (0 < readLen) {
        cVar4 = ref[lVar20];
        puVar2 = (ulong *)((long)__ptr_01 + (long)(iVar22 + -1) * 0x10);
        uVar15 = *puVar2;
        auVar55._0_8_ = uVar15 << 0x10;
        auVar55._8_8_ = puVar2[1] << 0x10 | uVar15 >> 0x30;
        lVar18 = 0;
        do {
          auVar54 = paddsw(auVar55,*(undefined1 (*) [16])((long)vProfile[cVar4 * iVar22] + lVar18));
          auVar55 = *(undefined1 (*) [16])((long)__ptr_02 + lVar18);
          sVar52 = auVar50._0_2_;
          sVar53 = auVar55._0_2_;
          uVar64 = (ushort)(sVar53 < sVar52) * sVar52 | (ushort)(sVar53 >= sVar52) * sVar53;
          sVar52 = auVar50._2_2_;
          sVar53 = auVar55._2_2_;
          uVar66 = (ushort)(sVar53 < sVar52) * sVar52 | (ushort)(sVar53 >= sVar52) * sVar53;
          sVar52 = auVar50._4_2_;
          sVar53 = auVar55._4_2_;
          uVar67 = (ushort)(sVar53 < sVar52) * sVar52 | (ushort)(sVar53 >= sVar52) * sVar53;
          sVar52 = auVar50._6_2_;
          sVar53 = auVar55._6_2_;
          uVar68 = (ushort)(sVar53 < sVar52) * sVar52 | (ushort)(sVar53 >= sVar52) * sVar53;
          sVar52 = auVar50._8_2_;
          sVar53 = auVar55._8_2_;
          uVar69 = (ushort)(sVar53 < sVar52) * sVar52 | (ushort)(sVar53 >= sVar52) * sVar53;
          sVar52 = auVar50._10_2_;
          sVar53 = auVar55._10_2_;
          uVar70 = (ushort)(sVar53 < sVar52) * sVar52 | (ushort)(sVar53 >= sVar52) * sVar53;
          sVar52 = auVar50._12_2_;
          sVar53 = auVar55._12_2_;
          sVar73 = auVar55._14_2_;
          uVar71 = (ushort)(sVar53 < sVar52) * sVar52 | (ushort)(sVar53 >= sVar52) * sVar53;
          sVar52 = auVar50._14_2_;
          uVar72 = (ushort)(sVar73 < sVar52) * sVar52 | (ushort)(sVar73 >= sVar52) * sVar73;
          sVar52 = auVar54._0_2_;
          auVar65._0_2_ =
               (ushort)((short)uVar64 < sVar52) * sVar52 | ((short)uVar64 >= sVar52) * uVar64;
          sVar52 = auVar54._2_2_;
          auVar65._2_2_ =
               (ushort)((short)uVar66 < sVar52) * sVar52 | ((short)uVar66 >= sVar52) * uVar66;
          sVar52 = auVar54._4_2_;
          auVar65._4_2_ =
               (ushort)((short)uVar67 < sVar52) * sVar52 | ((short)uVar67 >= sVar52) * uVar67;
          sVar52 = auVar54._6_2_;
          auVar65._6_2_ =
               (ushort)((short)uVar68 < sVar52) * sVar52 | ((short)uVar68 >= sVar52) * uVar68;
          sVar52 = auVar54._8_2_;
          auVar65._8_2_ =
               (ushort)((short)uVar69 < sVar52) * sVar52 | ((short)uVar69 >= sVar52) * uVar69;
          sVar52 = auVar54._10_2_;
          auVar65._10_2_ =
               (ushort)((short)uVar70 < sVar52) * sVar52 | ((short)uVar70 >= sVar52) * uVar70;
          sVar52 = auVar54._12_2_;
          auVar65._12_2_ =
               (ushort)((short)uVar71 < sVar52) * sVar52 | ((short)uVar71 >= sVar52) * uVar71;
          sVar52 = auVar54._14_2_;
          auVar65._14_2_ =
               (ushort)((short)uVar72 < sVar52) * sVar52 | ((short)uVar72 >= sVar52) * uVar72;
          uVar41 = ((short)uVar41 < (short)auVar65._0_2_) * auVar65._0_2_ |
                   ((short)uVar41 >= (short)auVar65._0_2_) * uVar41;
          uVar42 = ((short)uVar42 < (short)auVar65._2_2_) * auVar65._2_2_ |
                   ((short)uVar42 >= (short)auVar65._2_2_) * uVar42;
          uVar43 = ((short)uVar43 < (short)auVar65._4_2_) * auVar65._4_2_ |
                   ((short)uVar43 >= (short)auVar65._4_2_) * uVar43;
          uVar44 = ((short)uVar44 < (short)auVar65._6_2_) * auVar65._6_2_ |
                   ((short)uVar44 >= (short)auVar65._6_2_) * uVar44;
          uVar45 = ((short)uVar45 < (short)auVar65._8_2_) * auVar65._8_2_ |
                   ((short)uVar45 >= (short)auVar65._8_2_) * uVar45;
          uVar46 = ((short)uVar46 < (short)auVar65._10_2_) * auVar65._10_2_ |
                   ((short)uVar46 >= (short)auVar65._10_2_) * uVar46;
          uVar47 = ((short)uVar47 < (short)auVar65._12_2_) * auVar65._12_2_ |
                   ((short)uVar47 >= (short)auVar65._12_2_) * uVar47;
          uVar48 = ((short)uVar48 < (short)auVar65._14_2_) * auVar65._14_2_ |
                   ((short)uVar48 >= (short)auVar65._14_2_) * uVar48;
          *(undefined1 (*) [16])((long)__ptr_00 + lVar18) = auVar65;
          auVar54 = psubusw(auVar65,auVar23);
          auVar55 = psubusw(auVar55,auVar24);
          sVar52 = auVar54._0_2_;
          sVar49 = auVar55._0_2_;
          sVar53 = auVar54._2_2_;
          sVar57 = auVar55._2_2_;
          sVar73 = auVar54._4_2_;
          sVar58 = auVar55._4_2_;
          sVar5 = auVar54._6_2_;
          sVar59 = auVar55._6_2_;
          sVar6 = auVar54._8_2_;
          sVar60 = auVar55._8_2_;
          sVar7 = auVar54._10_2_;
          sVar61 = auVar55._10_2_;
          sVar8 = auVar54._12_2_;
          sVar62 = auVar55._12_2_;
          sVar63 = auVar55._14_2_;
          sVar9 = auVar54._14_2_;
          puVar3 = (ushort *)((long)__ptr_02 + lVar18);
          *puVar3 = (ushort)(sVar49 < sVar52) * sVar52 | (ushort)(sVar49 >= sVar52) * sVar49;
          puVar3[1] = (ushort)(sVar57 < sVar53) * sVar53 | (ushort)(sVar57 >= sVar53) * sVar57;
          puVar3[2] = (ushort)(sVar58 < sVar73) * sVar73 | (ushort)(sVar58 >= sVar73) * sVar58;
          puVar3[3] = (ushort)(sVar59 < sVar5) * sVar5 | (ushort)(sVar59 >= sVar5) * sVar59;
          puVar3[4] = (ushort)(sVar60 < sVar6) * sVar6 | (ushort)(sVar60 >= sVar6) * sVar60;
          puVar3[5] = (ushort)(sVar61 < sVar7) * sVar7 | (ushort)(sVar61 >= sVar7) * sVar61;
          puVar3[6] = (ushort)(sVar62 < sVar8) * sVar8 | (ushort)(sVar62 >= sVar8) * sVar62;
          puVar3[7] = (ushort)(sVar63 < sVar9) * sVar9 | (ushort)(sVar63 >= sVar9) * sVar63;
          auVar55 = psubusw(auVar50,auVar24);
          sVar49 = auVar55._0_2_;
          auVar50._0_2_ = (ushort)(sVar49 < sVar52) * sVar52 | (ushort)(sVar49 >= sVar52) * sVar49;
          sVar52 = auVar55._2_2_;
          auVar50._2_2_ = (ushort)(sVar52 < sVar53) * sVar53 | (ushort)(sVar52 >= sVar53) * sVar52;
          sVar52 = auVar55._4_2_;
          auVar50._4_2_ = (ushort)(sVar52 < sVar73) * sVar73 | (ushort)(sVar52 >= sVar73) * sVar52;
          sVar52 = auVar55._6_2_;
          auVar50._6_2_ = (ushort)(sVar52 < sVar5) * sVar5 | (ushort)(sVar52 >= sVar5) * sVar52;
          sVar52 = auVar55._8_2_;
          auVar50._8_2_ = (ushort)(sVar52 < sVar6) * sVar6 | (ushort)(sVar52 >= sVar6) * sVar52;
          sVar52 = auVar55._10_2_;
          auVar50._10_2_ = (ushort)(sVar52 < sVar7) * sVar7 | (ushort)(sVar52 >= sVar7) * sVar52;
          sVar52 = auVar55._12_2_;
          sVar53 = auVar55._14_2_;
          auVar50._12_2_ = (ushort)(sVar52 < sVar8) * sVar8 | (ushort)(sVar52 >= sVar8) * sVar52;
          auVar50._14_2_ = (ushort)(sVar53 < sVar9) * sVar9 | (ushort)(sVar53 >= sVar9) * sVar53;
          auVar55 = *(undefined1 (*) [16])((long)__ptr_01 + lVar18);
          lVar18 = lVar18 + 0x10;
        } while (lVar19 != lVar18);
      }
      iVar16 = 0;
      do {
        lVar18 = auVar50._8_8_;
        uVar15 = auVar50._0_8_;
        auVar50._0_8_ = uVar15 << 0x10;
        auVar50._8_8_ = lVar18 << 0x10 | uVar15 >> 0x30;
        if (0 < readLen) {
          lVar18 = 0;
          do {
            psVar1 = (short *)((long)__ptr_00 + lVar18);
            sVar53 = *psVar1;
            sVar73 = psVar1[1];
            sVar5 = psVar1[2];
            sVar6 = psVar1[3];
            sVar7 = psVar1[4];
            sVar8 = psVar1[5];
            sVar9 = psVar1[6];
            sVar49 = psVar1[7];
            sVar52 = auVar50._0_2_;
            auVar54._0_2_ = (ushort)(sVar53 < sVar52) * sVar52 | (ushort)(sVar53 >= sVar52) * sVar53
            ;
            sVar52 = auVar50._2_2_;
            auVar54._2_2_ = (ushort)(sVar73 < sVar52) * sVar52 | (ushort)(sVar73 >= sVar52) * sVar73
            ;
            sVar52 = auVar50._4_2_;
            auVar54._4_2_ = (ushort)(sVar5 < sVar52) * sVar52 | (ushort)(sVar5 >= sVar52) * sVar5;
            sVar52 = auVar50._6_2_;
            auVar54._6_2_ = (ushort)(sVar6 < sVar52) * sVar52 | (ushort)(sVar6 >= sVar52) * sVar6;
            sVar52 = auVar50._8_2_;
            auVar54._8_2_ = (ushort)(sVar7 < sVar52) * sVar52 | (ushort)(sVar7 >= sVar52) * sVar7;
            sVar52 = auVar50._10_2_;
            auVar54._10_2_ = (ushort)(sVar8 < sVar52) * sVar52 | (ushort)(sVar8 >= sVar52) * sVar8;
            sVar52 = auVar50._12_2_;
            auVar54._12_2_ = (ushort)(sVar9 < sVar52) * sVar52 | (ushort)(sVar9 >= sVar52) * sVar9;
            sVar52 = auVar50._14_2_;
            auVar54._14_2_ =
                 (ushort)(sVar49 < sVar52) * sVar52 | (ushort)(sVar49 >= sVar52) * sVar49;
            uVar41 = ((short)uVar41 < (short)auVar54._0_2_) * auVar54._0_2_ |
                     ((short)uVar41 >= (short)auVar54._0_2_) * uVar41;
            uVar42 = ((short)uVar42 < (short)auVar54._2_2_) * auVar54._2_2_ |
                     ((short)uVar42 >= (short)auVar54._2_2_) * uVar42;
            uVar43 = ((short)uVar43 < (short)auVar54._4_2_) * auVar54._4_2_ |
                     ((short)uVar43 >= (short)auVar54._4_2_) * uVar43;
            uVar44 = ((short)uVar44 < (short)auVar54._6_2_) * auVar54._6_2_ |
                     ((short)uVar44 >= (short)auVar54._6_2_) * uVar44;
            uVar45 = ((short)uVar45 < (short)auVar54._8_2_) * auVar54._8_2_ |
                     ((short)uVar45 >= (short)auVar54._8_2_) * uVar45;
            uVar46 = ((short)uVar46 < (short)auVar54._10_2_) * auVar54._10_2_ |
                     ((short)uVar46 >= (short)auVar54._10_2_) * uVar46;
            uVar47 = ((short)uVar47 < (short)auVar54._12_2_) * auVar54._12_2_ |
                     ((short)uVar47 >= (short)auVar54._12_2_) * uVar47;
            uVar48 = ((short)uVar48 < (short)auVar54._14_2_) * auVar54._14_2_ |
                     ((short)uVar48 >= (short)auVar54._14_2_) * uVar48;
            *(undefined1 (*) [16])((long)__ptr_00 + lVar18) = auVar54;
            auVar55 = psubusw(auVar54,auVar23);
            auVar50 = psubusw(auVar50,auVar24);
            auVar56._0_2_ = -(ushort)(auVar55._0_2_ < auVar50._0_2_);
            auVar56._2_2_ = -(ushort)(auVar55._2_2_ < auVar50._2_2_);
            auVar56._4_2_ = -(ushort)(auVar55._4_2_ < auVar50._4_2_);
            auVar56._6_2_ = -(ushort)(auVar55._6_2_ < auVar50._6_2_);
            auVar56._8_2_ = -(ushort)(auVar55._8_2_ < auVar50._8_2_);
            auVar56._10_2_ = -(ushort)(auVar55._10_2_ < auVar50._10_2_);
            auVar56._12_2_ = -(ushort)(auVar55._12_2_ < auVar50._12_2_);
            auVar56._14_2_ = -(ushort)(auVar55._14_2_ < auVar50._14_2_);
            if ((((((((((((((((auVar56 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar56 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar56 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar56 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar56 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar56 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar56 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar56 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar56 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar56 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar56 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar56 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar56 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar56 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar56._14_2_ >> 7 & 1) == 0) && (auVar56._14_2_ & 0x8000) == 0)
            goto LAB_00102be1;
            lVar18 = lVar18 + 0x10;
          } while (lVar19 != lVar18);
        }
        iVar16 = iVar16 + 1;
      } while (iVar16 != 8);
LAB_00102be1:
      uVar25 = ((short)uVar25 < (short)uVar41) * uVar41 | ((short)uVar25 >= (short)uVar41) * uVar25;
      uVar26 = ((short)uVar26 < (short)uVar42) * uVar42 | ((short)uVar26 >= (short)uVar42) * uVar26;
      uVar27 = ((short)uVar27 < (short)uVar43) * uVar43 | ((short)uVar27 >= (short)uVar43) * uVar27;
      uVar28 = ((short)uVar28 < (short)uVar44) * uVar44 | ((short)uVar28 >= (short)uVar44) * uVar28;
      uVar29 = ((short)uVar29 < (short)uVar45) * uVar45 | ((short)uVar29 >= (short)uVar45) * uVar29;
      uVar30 = ((short)uVar30 < (short)uVar46) * uVar46 | ((short)uVar30 >= (short)uVar46) * uVar30;
      uVar31 = ((short)uVar31 < (short)uVar47) * uVar47 | ((short)uVar31 >= (short)uVar47) * uVar31;
      uVar32 = ((short)uVar32 < (short)uVar48) * uVar48 | ((short)uVar32 >= (short)uVar48) * uVar32;
      auVar51._0_2_ = -(ushort)(uVar33 == uVar25);
      auVar51._2_2_ = -(ushort)(uVar34 == uVar26);
      auVar51._4_2_ = -(ushort)(uVar35 == uVar27);
      auVar51._6_2_ = -(ushort)(uVar36 == uVar28);
      auVar51._8_2_ = -(ushort)(uVar37 == uVar29);
      auVar51._10_2_ = -(ushort)(uVar38 == uVar30);
      auVar51._12_2_ = -(ushort)(uVar39 == uVar31);
      auVar51._14_2_ = -(ushort)(uVar40 == uVar32);
      if ((ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                   (ushort)((byte)(auVar51._14_2_ >> 7) & 1) << 0xe | auVar51._14_2_ & 0x8000) !=
          0xffff) {
        uVar33 = ((short)uVar29 < (short)uVar25) * uVar25 |
                 ((short)uVar29 >= (short)uVar25) * uVar29;
        uVar34 = ((short)uVar30 < (short)uVar26) * uVar26 |
                 ((short)uVar30 >= (short)uVar26) * uVar30;
        uVar35 = ((short)uVar31 < (short)uVar27) * uVar27 |
                 ((short)uVar31 >= (short)uVar27) * uVar31;
        uVar36 = ((short)uVar32 < (short)uVar28) * uVar28 |
                 ((short)uVar32 >= (short)uVar28) * uVar32;
        uVar33 = ((short)uVar35 < (short)uVar33) * uVar33 |
                 ((short)uVar35 >= (short)uVar33) * uVar35;
        uVar34 = ((short)uVar36 < (short)uVar34) * uVar34 |
                 ((short)uVar36 >= (short)uVar34) * uVar36;
        uVar64 = ((short)uVar34 < (short)uVar33) * uVar33 |
                 ((short)uVar34 >= (short)uVar33) * uVar34;
        uVar33 = uVar25;
        uVar34 = uVar26;
        uVar35 = uVar27;
        uVar36 = uVar28;
        uVar37 = uVar29;
        uVar38 = uVar30;
        uVar39 = uVar31;
        uVar40 = uVar32;
        if ((uVar21 < uVar64) && (local_60 = (int)lVar20, uVar21 = uVar64, 0 < readLen)) {
          lVar18 = 0;
          do {
            uVar11 = ((undefined8 *)((long)__ptr_00 + lVar18))[1];
            *(undefined8 *)((long)__ptr_03 + lVar18) = *(undefined8 *)((long)__ptr_00 + lVar18);
            ((undefined8 *)((long)__ptr_03 + lVar18))[1] = uVar11;
            lVar18 = lVar18 + 0x10;
          } while (lVar19 != lVar18);
        }
      }
      uVar41 = ((short)uVar45 < (short)uVar41) * uVar41 | ((short)uVar45 >= (short)uVar41) * uVar45;
      uVar42 = ((short)uVar46 < (short)uVar42) * uVar42 | ((short)uVar46 >= (short)uVar42) * uVar46;
      uVar43 = ((short)uVar47 < (short)uVar43) * uVar43 | ((short)uVar47 >= (short)uVar43) * uVar47;
      uVar44 = ((short)uVar48 < (short)uVar44) * uVar44 | ((short)uVar48 >= (short)uVar44) * uVar48;
      uVar41 = ((short)uVar43 < (short)uVar41) * uVar41 | ((short)uVar43 >= (short)uVar41) * uVar43;
      uVar42 = ((short)uVar44 < (short)uVar42) * uVar42 | ((short)uVar44 >= (short)uVar42) * uVar44;
      uVar41 = ((short)uVar42 < (short)uVar41) * uVar41 | ((short)uVar42 >= (short)uVar41) * uVar42;
      *(ushort *)((long)__ptr + lVar20 * 2) = uVar41;
    } while ((uVar41 != terminate) &&
            (lVar20 = lVar20 + (ulong)(ref_dir != '\x01') * 2 + -1, pvVar12 = __ptr_00,
            iVar14 != (int)lVar20));
  }
  iVar16 = readLen + -1;
  if (0 < readLen) {
    iVar14 = 1;
    if (1 < iVar22 * 8) {
      iVar14 = iVar22 * 8;
    }
    uVar15 = 0;
    do {
      if ((*(uint16_t *)((long)__ptr_03 + uVar15 * 2) == uVar21) &&
         (iVar17 = ((uint)uVar15 & 7) * iVar22 + ((uint)(uVar15 >> 3) & 0x1fffffff), iVar17 < iVar16
         )) {
        iVar16 = iVar17;
      }
      uVar15 = uVar15 + 1;
    } while (iVar14 != (int)uVar15);
  }
  free(__ptr_03);
  free(__ptr_02);
  free(__ptr_01);
  free(__ptr_00);
  paVar13 = (alignment_end *)calloc(2,0xc);
  paVar13->score = uVar21;
  paVar13->ref = local_60;
  paVar13->read = iVar16;
  paVar13[1].score = 0;
  paVar13[1].ref = 0;
  paVar13[1].read = 0;
  if (local_60 - maskLen == 0 || local_60 < maskLen) {
    uVar21 = 0;
  }
  else {
    uVar15 = 0;
    uVar21 = 0;
    do {
      uVar33 = *(ushort *)((long)__ptr + uVar15 * 2);
      if (uVar21 < uVar33) {
        paVar13[1].ref = (int32_t)uVar15;
        uVar21 = uVar33;
      }
      uVar15 = uVar15 + 1;
    } while ((uint)(local_60 - maskLen) != uVar15);
    paVar13[1].score = uVar21;
  }
  local_60 = local_60 + maskLen;
  if (local_60 < refLen) {
    lVar19 = (long)local_60;
    do {
      uVar33 = *(ushort *)((long)__ptr + lVar19 * 2);
      if (uVar21 < uVar33) {
        paVar13[1].ref = local_60;
        uVar21 = uVar33;
      }
      lVar19 = lVar19 + 1;
      local_60 = local_60 + 1;
    } while (lVar19 < refLen);
    paVar13[1].score = uVar21;
  }
  free(__ptr);
  return paVar13;
}

Assistant:

static alignment_end* sw_sse2_word (const int8_t* ref,
							 int8_t ref_dir,	/* 0: forward ref; 1: reverse ref*/
							 int32_t refLen,
							 int32_t readLen,
							 const uint8_t weight_gapO, /* will be used as - */
							 const uint8_t weight_gapE, /* will be used as - */
							 const __m128i* vProfile,
							 uint16_t terminate,
							 int32_t maskLen) {

#define max8(m, vm) (vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 8)); \
					(vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 4)); \
					(vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 2)); \
					(m) = _mm_extract_epi16((vm), 0)

	uint16_t max = 0;		                     /* the max alignment score */
	int32_t end_read = readLen - 1;
	int32_t end_ref = 0; /* 1_based best alignment ending point; Initialized as isn't aligned - 0. */
	int32_t segLen = (readLen + 7) / 8; /* number of segment */

	/* array to record the largest score of each reference position */
	uint16_t* maxColumn = (uint16_t*) calloc(refLen, 2);

	/* array to record the alignment read ending position of the largest score of each reference position */
	int32_t* end_read_column = (int32_t*) calloc(refLen, sizeof(int32_t));

	/* Define 16 byte 0 vector. */
	__m128i vZero = _mm_set1_epi32(0);

	__m128i* pvHStore = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvHLoad = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvE = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvHmax = (__m128i*) calloc(segLen, sizeof(__m128i));

	int32_t i, j, k;
	/* 16 byte insertion begin vector */
	__m128i vGapO = _mm_set1_epi16(weight_gapO);

	/* 16 byte insertion extension vector */
	__m128i vGapE = _mm_set1_epi16(weight_gapE);

	__m128i vMaxScore = vZero; /* Trace the highest score of the whole SW matrix. */
	__m128i vMaxMark = vZero; /* Trace the highest score till the previous column. */
	__m128i vTemp;
	int32_t edge, begin = 0, end = refLen, step = 1;
	uint16_t *t;
	int32_t column_len;
	alignment_end* bests;

	/* outer loop to process the reference sequence */
	if (ref_dir == 1) {
		begin = refLen - 1;
		end = -1;
		step = -1;
	}
	for (i = begin; LIKELY(i != end); i += step) {
		__m128i* pv;
		__m128i vMaxColumn;
		const __m128i* vP;
		int32_t cmp;
		__m128i e, vF = vZero; /* Initialize F value to 0.
							   Any errors to vH values will be corrected in the Lazy_F loop.
							 */
		__m128i vH = pvHStore[segLen - 1];
		vH = _mm_slli_si128 (vH, 2); /* Shift the 128-bit value in vH left by 2 byte. */

		/* Swap the 2 H buffers. */
		pv = pvHLoad;

		vMaxColumn = vZero; /* vMaxColumn is used to record the max values of column i. */

		vP = vProfile + ref[i] * segLen; /* Right part of the vProfile */
		pvHLoad = pvHStore;
		pvHStore = pv;

		/* inner loop to process the query sequence */
		for (j = 0; LIKELY(j < segLen); j ++) {
			vH = _mm_adds_epi16(vH, _mm_load_si128(vP + j));

			/* Get max from vH, vE and vF. */
			e = _mm_load_si128(pvE + j);
			vH = _mm_max_epi16(vH, e);
			vH = _mm_max_epi16(vH, vF);
			vMaxColumn = _mm_max_epi16(vMaxColumn, vH);

			/* Save vH values. */
			_mm_store_si128(pvHStore + j, vH);

			/* Update vE value. */
			vH = _mm_subs_epu16(vH, vGapO); /* saturation arithmetic, result >= 0 */
			e = _mm_subs_epu16(e, vGapE);
			e = _mm_max_epi16(e, vH);
			_mm_store_si128(pvE + j, e);

			/* Update vF value. */
			vF = _mm_subs_epu16(vF, vGapE);
			vF = _mm_max_epi16(vF, vH);

			/* Load the next vH. */
			vH = _mm_load_si128(pvHLoad + j);
		}

		/* Lazy_F loop: has been revised to disallow adjecent insertion and then deletion, so don't update E(i, j), learn from SWPS3 */
		for (k = 0; LIKELY(k < 8); ++k) {
			vF = _mm_slli_si128 (vF, 2);
			for (j = 0; LIKELY(j < segLen); ++j) {
				vH = _mm_load_si128(pvHStore + j);
				vH = _mm_max_epi16(vH, vF);
				vMaxColumn = _mm_max_epi16(vMaxColumn, vH); /*newly added line*/
				_mm_store_si128(pvHStore + j, vH);
				vH = _mm_subs_epu16(vH, vGapO);
				vF = _mm_subs_epu16(vF, vGapE);
				if (UNLIKELY(! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH)))) goto end;
			}
		}

end:
		vMaxScore = _mm_max_epi16(vMaxScore, vMaxColumn);
		vTemp = _mm_cmpeq_epi16(vMaxMark, vMaxScore);
		cmp = _mm_movemask_epi8(vTemp);
		if (cmp != 0xffff) {
			uint16_t temp;
			vMaxMark = vMaxScore;
			max8(temp, vMaxScore);
			vMaxScore = vMaxMark;

			if (LIKELY(temp > max)) {
				max = temp;
				end_ref = i;
				for (j = 0; LIKELY(j < segLen); ++j) pvHmax[j] = pvHStore[j];
			}
		}

		/* Record the max score of current column. */
		max8(maxColumn[i], vMaxColumn);
		if (maxColumn[i] == terminate) break;
	}

	/* Trace the alignment ending position on read. */
	t = (uint16_t*)pvHmax;
	column_len = segLen * 8;
	for (i = 0; LIKELY(i < column_len); ++i, ++t) {
		int32_t temp;
		if (*t == max) {
			temp = i / 8 + i % 8 * segLen;
			if (temp < end_read) end_read = temp;
		}
	}

	free(pvHmax);
	free(pvE);
	free(pvHLoad);
	free(pvHStore);

	/* Find the most possible 2nd best alignment. */
	bests = (alignment_end*) calloc(2, sizeof(alignment_end));
	bests[0].score = max;
	bests[0].ref = end_ref;
	bests[0].read = end_read;

	bests[1].score = 0;
	bests[1].ref = 0;
	bests[1].read = 0;

	edge = (end_ref - maskLen) > 0 ? (end_ref - maskLen) : 0;
	for (i = 0; i < edge; i ++) {
		if (maxColumn[i] > bests[1].score) {
			bests[1].score = maxColumn[i];
			bests[1].ref = i;
		}
	}
	edge = (end_ref + maskLen) > refLen ? refLen : (end_ref + maskLen);
	for (i = edge; i < refLen; i ++) {
		if (maxColumn[i] > bests[1].score) {
			bests[1].score = maxColumn[i];
			bests[1].ref = i;
		}
	}

	free(maxColumn);
	free(end_read_column);
	return bests;
}